

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

UntypedActionResultHolderBase * __thiscall
testing::internal::
FunctionMocker<const_solitaire::piles::interfaces::FoundationPile_&(solitaire::piles::PileId)>::
UntypedPerformAction
          (FunctionMocker<const_solitaire::piles::interfaces::FoundationPile_&(solitaire::piles::PileId)>
           *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<const_solitaire::piles::interfaces::FoundationPile_&> *pAVar1;
  Action<const_solitaire::piles::interfaces::FoundationPile_&(solitaire::piles::PileId)> action;
  _Any_data local_30;
  _Manager_type local_20;
  
  std::function<const_solitaire::piles::interfaces::FoundationPile_&(solitaire::piles::PileId)>::
  function((function<const_solitaire::piles::interfaces::FoundationPile_&(solitaire::piles::PileId)>
            *)&local_30,
           (function<const_solitaire::piles::interfaces::FoundationPile_&(solitaire::piles::PileId)>
            *)untyped_action);
  pAVar1 = ActionResultHolder<solitaire::piles::interfaces::FoundationPile_const&>::
           PerformAction<solitaire::piles::interfaces::FoundationPile_const&(solitaire::piles::PileId)>
                     ((Action<const_solitaire::piles::interfaces::FoundationPile_&(solitaire::piles::PileId)>
                       *)&local_30,(ArgumentTuple *)untyped_args);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, void* untyped_args) const override {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    ArgumentTuple* args = static_cast<ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, std::move(*args));
  }